

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

int Js::JavascriptString::LastIndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              charcount_t searchLen,charcount_t position)

{
  code *pcVar1;
  char16 *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  uint *puVar7;
  charcount_t local_5c;
  uint32 backwardOffset;
  uint32 remaining;
  char16 *p;
  charcount_t local_40;
  WCHAR c;
  uint32 lMatchedJump;
  charcount_t cStack_34;
  char16 searchFirst;
  charcount_t position_local;
  charcount_t searchLen_local;
  char16 *searchStr_local;
  char16 *pcStack_20;
  charcount_t len_local;
  char16 *inputStr_local;
  Boyer_Moore_Jump *jmpTable_local;
  
  lMatchedJump = position;
  cStack_34 = searchLen;
  _position_local = searchStr;
  searchStr_local._4_4_ = len;
  pcStack_20 = inputStr;
  inputStr_local = (char16 *)jmpTable;
  if (searchLen == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xda8,"(searchLen > 0)","searchLen > 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pcVar2 = pcStack_20;
  c = *_position_local;
  local_40 = cStack_34;
  if (*(int *)(inputStr_local + (ulong)(ushort)c * 2) != 0) {
    local_40 = *(charcount_t *)(inputStr_local + (ulong)(ushort)c * 2);
  }
  backwardOffset = searchStr_local._4_4_ - cStack_34;
  puVar7 = min<unsigned_int>(&backwardOffset,&lMatchedJump);
  _remaining = pcVar2 + *puVar7;
  while( true ) {
    uVar4 = (uint)((long)_remaining - (long)pcStack_20 >> 1);
    if (*_remaining == c) {
      iVar5 = PAL_wmemcmp(_remaining,_position_local,(ulong)cStack_34);
      if (iVar5 == 0) {
        return uVar4;
      }
      local_5c = local_40;
    }
    else {
      p._6_2_ = *_remaining;
      if (((p._6_2_ & 0xff80U) == 0) && (*(int *)(inputStr_local + (ulong)(ushort)p._6_2_ * 2) != 0)
         ) {
        local_5c = *(charcount_t *)(inputStr_local + (ulong)(ushort)p._6_2_ * 2);
      }
      else {
        local_5c = cStack_34;
      }
    }
    if (local_5c == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xdcb,"(backwardOffset > 0)","backwardOffset > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (uVar4 < local_5c) break;
    _remaining = _remaining + -(ulong)local_5c;
  }
  return -1;
}

Assistant:

int JavascriptString::LastIndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, charcount_t searchLen, charcount_t position)
    {
        Assert(searchLen > 0);
        const char16 searchFirst = searchStr[0];
        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchFirst].shift > 0)
        {
            lMatchedJump = jmpTable[searchFirst].shift;
        }
        WCHAR c;
        char16 const * p = inputStr + min(len - searchLen, position);

        while (true)
        {
            uint32 remaining = (uint32)(p - inputStr);
            uint32 backwardOffset = 0;
            // first character match, keep checking
            if (*p == searchFirst)
            {
                if (wmemcmp(p, searchStr, searchLen) == 0)
                {
                    return (int)remaining;
                }
                backwardOffset = lMatchedJump;
            }
            else
            {
                c = *p;
                if (0 == (c & ~0x7f) && jmpTable[c].shift != 0)
                {
                    backwardOffset = jmpTable[c].shift;
                }
                else
                {
                    backwardOffset = searchLen;
                }
            }
            AssertOrFailFast(backwardOffset > 0);
            if (backwardOffset > remaining)
            {
                break;
            }
            p -= backwardOffset;
        }

        return -1;
    }